

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_stor_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  connectdata *conn;
  _Bool connected;
  _Bool local_19;
  
  if (ftpcode < 400) {
    pcVar1 = data->conn;
    (pcVar1->proto).ftpc.state_saved = FTP_STOR;
    if (((data->set).field_0x8e3 & 4) == 0) {
      CVar2 = InitiateTransfer(data);
      return CVar2;
    }
    (data->conn->proto).ftpc.state = FTP_STOP;
    CVar2 = AllowServerConnect(data,&local_19);
    if ((CVar2 == CURLE_OK) && (local_19 == false)) {
      Curl_infof(data,"Data conn was not available immediately");
      (pcVar1->proto).ftpc.wait_data_conn = true;
    }
  }
  else {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    (data->conn->proto).ftpc.state = FTP_STOP;
    CVar2 = CURLE_UPLOAD_FAILED;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct Curl_easy *data,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode >= 400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    state(data, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    bool connected;

    state(data, FTP_STOP); /* no longer in STOR state */

    result = AllowServerConnect(data, &connected);
    if(result)
      return result;

    if(!connected) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      infof(data, "Data conn was not available immediately");
      ftpc->wait_data_conn = TRUE;
    }

    return CURLE_OK;
  }
  return InitiateTransfer(data);
}